

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O3

void __thiscall
QGraphicsWidgetPrivate::windowFrameHoverLeaveEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneHoverEvent *event)

{
  byte bVar1;
  SubControl SVar2;
  undefined4 uVar3;
  QGraphicsItem *pQVar4;
  undefined4 uVar5;
  pointer __old_p;
  WindowData *pWVar6;
  QGraphicsItem *pQVar7;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  double local_28;
  double local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((~(this->windowFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 0x1001) == 0) {
    pQVar4 = (this->super_QGraphicsItemPrivate).q_ptr;
    pQVar7 = pQVar4 + -1;
    if (pQVar4 == (QGraphicsItem *)0x0) {
      pQVar7 = (QGraphicsItem *)0x0;
    }
    QGraphicsItem::unsetCursor(pQVar7 + 1);
    pWVar6 = (this->windowData)._M_t.
             super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ._M_t.
             super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
    if (pWVar6 == (WindowData *)0x0) {
      pWVar6 = (WindowData *)operator_new(0x58);
      (pWVar6->startGeometry).xp = 0.0;
      (pWVar6->startGeometry).yp = 0.0;
      (pWVar6->startGeometry).w = 0.0;
      (pWVar6->startGeometry).h = 0.0;
      (pWVar6->buttonRect).x1 = 0;
      (pWVar6->buttonRect).y1 = 0;
      (pWVar6->windowTitle).d.d = 0;
      *(char16_t **)((long)&(pWVar6->windowTitle).d + 8) = (char16_t *)0x0;
      *(qsizetype *)((long)&(pWVar6->windowTitle).d + 0x10) = 0;
      pWVar6->hoveredSubControl = SC_None;
      pWVar6->grabbedSection = NoSection;
      pWVar6->field_0x20 = 0;
      (pWVar6->buttonRect).x2 = -1;
      (pWVar6->buttonRect).y2 = -1;
      (this->windowData)._M_t.
      super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      ._M_t.
      super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
      .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl = pWVar6;
    }
    SVar2 = pWVar6->hoveredSubControl;
    bVar1 = pWVar6->field_0x20;
    pWVar6->hoveredSubControl = SC_None;
    pWVar6->field_0x20 = bVar1 & 0xfe;
    pWVar6 = (this->windowData)._M_t.
             super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ._M_t.
             super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
    (pWVar6->buttonRect).x1 = 0;
    (pWVar6->buttonRect).y1 = 0;
    (pWVar6->buttonRect).x2 = -1;
    (pWVar6->buttonRect).y2 = -1;
    if (SVar2 == SC_ComboBoxListBoxPopup || (bVar1 & 1) != 0) {
      pWVar6 = (this->windowData)._M_t.
               super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               ._M_t.
               super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
               .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
      uVar3 = (pWVar6->buttonRect).x1;
      uVar5 = (pWVar6->buttonRect).y1;
      local_38._8_4_ = SUB84((double)(int)uVar5,0);
      local_38._0_8_ = (double)(int)uVar3;
      local_38._12_4_ = (int)((ulong)(double)(int)uVar5 >> 0x20);
      local_28 = (double)(((long)(pWVar6->buttonRect).x2.m_i - (long)(int)uVar3) + 1);
      local_20 = (double)(((long)(pWVar6->buttonRect).y2.m_i - (long)(int)uVar5) + 1);
      QGraphicsItem::update(pQVar7 + 1,(QRectF *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameHoverLeaveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_UNUSED(event);
    Q_Q(QGraphicsWidget);
    if (hasDecoration()) {
        // ### restore the cursor, don't override it
#ifndef QT_NO_CURSOR
        q->unsetCursor();
#endif

        ensureWindowData();

        bool needsUpdate = false;
        if (windowData->hoveredSubControl == QStyle::SC_TitleBarCloseButton
            || windowData->buttonMouseOver)
            needsUpdate = true;

        // update the hover state (of buttons etc...)
        windowData->hoveredSubControl = QStyle::SC_None;
        windowData->buttonMouseOver = false;
        windowData->buttonRect = QRect();
        if (needsUpdate)
            q->update(windowData->buttonRect);
    }
}